

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
 __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
::
internal_find_unique<S2Shape*,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>&,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>*>>
          (btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
           *this,S2Shape **key,
          btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
          iter)

{
  uint i;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  *this_00;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  *pbVar1;
  char *__function;
  ulong uVar2;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
  bVar3;
  
  this_00 = iter.node;
  if (this_00 !=
      (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
       *)0x0) {
    for (; i = btree_node<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
               ::binary_search<S2Shape*,std::less<S2Shape*>>
                         ((btree_node<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
                           *)this_00,key,(less<S2Shape_*> *)this), ((ulong)this_00 & 7) == 0;
        this_00 = btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                  ::child(this_00,i)) {
      if (this_00[0xb] !=
          (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
           )0x0) goto LAB_00229407;
    }
LAB_0022944f:
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
LAB_00229464:
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                  ,0x1e1,__function);
  }
  goto LAB_00229445;
  while( true ) {
    pbVar1 = *(btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
               **)this_00;
    if (((ulong)pbVar1 & 7) != 0) goto LAB_0022944f;
    if (pbVar1[0xb] !=
        (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
         )0x0) {
      pbVar1 = (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                *)0x0;
    }
    i = (uint)(byte)this_00[8];
    this_00 = pbVar1;
    if (pbVar1 == (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                   *)0x0) break;
LAB_00229407:
    if (((ulong)this_00 & 7) != 0) goto LAB_0022944f;
    if (i != (byte)this_00[10]) break;
  }
  if (this_00 !=
      (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
       *)0x0) {
    if (((ulong)this_00 & 7) != 0) {
      __function = 
      "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
      ;
      goto LAB_00229464;
    }
    pbVar1 = (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
              *)0x0;
    if (*(S2Shape **)(this_00 + (long)(int)i * 0x20 + 0x10) <= *key) {
      pbVar1 = this_00;
    }
    uVar2 = (ulong)i;
    if (*(S2Shape **)(this_00 + (long)(int)i * 0x20 + 0x10) > *key) {
      uVar2 = 0;
    }
    goto LAB_00229449;
  }
LAB_00229445:
  pbVar1 = (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
            *)0x0;
  uVar2 = 0;
LAB_00229449:
  bVar3._8_8_ = uVar2;
  bVar3.node = pbVar1;
  return bVar3;
}

Assistant:

IterType btree<P>::internal_find_unique(
    const K &key, IterType iter) const {
  const_lookup_key_reference<K> lookup_key(key);
  if (iter.node) {
    std::pair<IterType, int> res = internal_locate(lookup_key, iter);
    if (res.second == kExactMatch) {
      return res.first;
    }
    if (!res.second) {
      iter = internal_last(res.first);
      if (iter.node && !compare_keys(lookup_key, iter.key())) {
        return iter;
      }
    }
  }
  return IterType(nullptr, 0);
}